

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O0

void __thiscall picojson::value::value(value *this,value *x)

{
  string *psVar1;
  value *x_local;
  value *this_local;
  
  this->type_ = x->type_;
  switch(this->type_) {
  case 1:
    (this->field_1).boolean_ = (bool)((x->field_1).boolean_ & 1);
    break;
  case 2:
    this->field_1 = x->field_1;
    break;
  case 3:
    psVar1 = (string *)operator_new(0x20);
    std::__cxx11::string::string((string *)psVar1,(string *)(x->field_1).string_);
    (this->field_1).string_ = psVar1;
    break;
  case 4:
    psVar1 = (string *)operator_new(0x18);
    std::vector<picojson::value,_std::allocator<picojson::value>_>::vector
              ((vector<picojson::value,_std::allocator<picojson::value>_> *)psVar1,
               (vector<picojson::value,_std::allocator<picojson::value>_> *)(x->field_1).string_);
    (this->field_1).string_ = psVar1;
    break;
  case 5:
    psVar1 = (string *)operator_new(0x30);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
           *)psVar1,
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
           *)(x->field_1).string_);
    (this->field_1).string_ = psVar1;
  }
  return;
}

Assistant:

inline value::value(const value& x) : type_(x.type_) {
    switch (type_) {
#define INIT(p, v) case p##type: p = v; break
      INIT(boolean_, x.boolean_);
      INIT(number_, x.number_);
      INIT(string_, new std::string(*x.string_));
      INIT(array_, new array(*x.array_));
      INIT(object_, new object(*x.object_));
#undef INIT
    default: break;
    }
  }